

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O0

void SetAllMatid(TPZGeoEl *gel,int matid)

{
  int in_ESI;
  TPZGeoEl *in_RDI;
  TPZGeoEl *fat;
  undefined8 local_18;
  undefined4 in_stack_fffffffffffffff0;
  
  TPZGeoEl::SetMaterialId(in_RDI,in_ESI);
  local_18 = TPZGeoEl::Father((TPZGeoEl *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  while (local_18 != (TPZGeoEl *)0x0) {
    TPZGeoEl::SetMaterialId(local_18,in_ESI);
    local_18 = TPZGeoEl::Father((TPZGeoEl *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  }
  SetSubMatid(fat,(int)((ulong)in_RDI >> 0x20));
  return;
}

Assistant:

static void SetAllMatid(TPZGeoEl *gel, int matid)
{
    gel->SetMaterialId(matid);
    TPZGeoEl *fat = gel->Father();
    while (fat) {
        fat->SetMaterialId(matid);
        fat = fat->Father();
    }
    SetSubMatid(gel, matid);
}